

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::OP_SetNativeFloatElementI_NoConvert
               (Var instance,Var aElementIndex,ScriptContext *scriptContext,
               PropertyOperationFlags flags,double dValue)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  
  BVar3 = OP_SetNativeFloatElementI(instance,aElementIndex,scriptContext,flags,dValue);
  if (BVar3 == 0) {
    return 0;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                              ,0x131e,"(false)","Unexpected native array conversion");
  if (bVar2) {
    *puVar4 = 0;
    Throw::FatalInternalError(-0x7fffbffb);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BOOL JavascriptOperators::OP_SetNativeFloatElementI_NoConvert(
        Var instance,
        Var aElementIndex,
        ScriptContext* scriptContext,
        PropertyOperationFlags flags,
        double dValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetNativeFloatElementI_NoConvert);
        JIT_HELPER_SAME_ATTRIBUTES(Op_SetNativeFloatElementI_NoConvert, Op_SetNativeFloatElementI);
        BOOL converted = OP_SetNativeFloatElementI(instance, aElementIndex, scriptContext, flags, dValue);
        if (converted)
        {
            AssertMsg(false, "Unexpected native array conversion");
            Js::Throw::FatalInternalError();
        }
        return FALSE;
        JIT_HELPER_END(Op_SetNativeFloatElementI_NoConvert);
    }